

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_> __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder *this)

{
  CartesianProductGenerator<const_char_*,_std::tuple<const_char_*,_const_char_*>_> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  tuple<testing::internal::ValueArray<const_char_*>,_testing::internal::CartesianProductHolder<testing::internal::ParamGenerator<const_char_*>,_testing::internal::ParamGenerator<const_char_*>_>_>
  *in_RSI;
  ParamGenerator<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_> PVar1;
  tuple<testing::internal::ParamGenerator<const_char_*>,_testing::internal::ParamGenerator<std::tuple<const_char_*,_const_char_*>_>_>
  local_38;
  CartesianProductHolder<testing::internal::ValueArray<const_char_*>,_testing::internal::CartesianProductHolder<testing::internal::ParamGenerator<const_char_*>,_testing::internal::ParamGenerator<const_char_*>_>_>
  *this_local;
  
  this_local = (CartesianProductHolder<testing::internal::ValueArray<const_char_*>,_testing::internal::CartesianProductHolder<testing::internal::ParamGenerator<const_char_*>,_testing::internal::ParamGenerator<const_char_*>_>_>
                *)this;
  this_00 = (CartesianProductGenerator<const_char_*,_std::tuple<const_char_*,_const_char_*>_> *)
            operator_new(0x28);
  std::
  tuple<testing::internal::ParamGenerator<const_char_*>,_testing::internal::ParamGenerator<std::tuple<const_char_*,_const_char_*>_>_>
  ::
  tuple<testing::internal::ValueArray<const_char_*>,_testing::internal::CartesianProductHolder<testing::internal::ParamGenerator<const_char_*>,_testing::internal::ParamGenerator<const_char_*>_>,_true>
            (&local_38,in_RSI);
  CartesianProductGenerator<const_char_*,_std::tuple<const_char_*,_const_char_*>_>::
  CartesianProductGenerator(this_00,&local_38);
  ParamGenerator<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>::ParamGenerator
            ((ParamGenerator<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_> *)
             this,(ParamGeneratorInterface<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>
                   *)this_00);
  std::
  tuple<testing::internal::ParamGenerator<const_char_*>,_testing::internal::ParamGenerator<std::tuple<const_char_*,_const_char_*>_>_>
  ::~tuple(&local_38);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }